

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_copyfile(uv_fs_t *req)

{
  uv_fs_cb p_Var1;
  uint __fd;
  int iVar2;
  int iVar3;
  int *piVar4;
  size_t local_328;
  size_t bytes_chunk;
  off_t bytes_written;
  off_t in_offset;
  off_t bytes_to_send;
  int local_300;
  int err;
  int result;
  int dst_flags;
  stat dst_statsbuf;
  stat src_statsbuf;
  uv_file dstfd;
  uv_file srcfd;
  uv_fs_t fs_req;
  uv_fs_t *req_local;
  
  src_statsbuf.__glibc_reserved[2]._0_4_ = -1;
  bytes_to_send._4_4_ = 0;
  fs_req.bufsml[3].len = (size_t)req;
  __fd = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&dstfd,req->path,0,0,(uv_fs_cb)0x0);
  uv_fs_req_cleanup((uv_fs_t *)&dstfd);
  if ((int)__fd < 0) {
    return (long)(int)__fd;
  }
  iVar2 = fstat(__fd,(stat *)(dst_statsbuf.__glibc_reserved + 2));
  if (iVar2 == 0) {
    err = 0x41;
    if ((*(uint *)(fs_req.bufsml[3].len + 0x11c) & 1) != 0) {
      err = 0xc1;
    }
    src_statsbuf.__glibc_reserved[2]._0_4_ =
         uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&dstfd,*(char **)(fs_req.bufsml[3].len + 0x110),err,
                    (__mode_t)src_statsbuf.st_nlink,(uv_fs_cb)0x0);
    uv_fs_req_cleanup((uv_fs_t *)&dstfd);
    iVar2 = (int)src_statsbuf.__glibc_reserved[2];
    if (-1 < (int)src_statsbuf.__glibc_reserved[2]) {
      if ((*(uint *)(fs_req.bufsml[3].len + 0x11c) & 1) == 0) {
        iVar2 = fstat((int)src_statsbuf.__glibc_reserved[2],(stat *)&result);
        if (iVar2 != 0) {
          piVar4 = __errno_location();
          iVar2 = -*piVar4;
          goto LAB_0045353e;
        }
        if ((dst_statsbuf.__glibc_reserved[2] == _result) &&
           (iVar2 = bytes_to_send._4_4_, src_statsbuf.st_dev == dst_statsbuf.st_dev))
        goto LAB_0045353e;
        iVar2 = ftruncate((int)src_statsbuf.__glibc_reserved[2],0);
        if (iVar2 != 0) {
          piVar4 = __errno_location();
          iVar2 = -*piVar4;
          goto LAB_0045353e;
        }
      }
      iVar2 = fchmod((int)src_statsbuf.__glibc_reserved[2],(__mode_t)src_statsbuf.st_nlink);
      if (iVar2 == -1) {
        piVar4 = __errno_location();
        iVar2 = -*piVar4;
        if ((iVar2 != -1) ||
           (iVar3 = uv__is_cifs_or_smb((int)src_statsbuf.__glibc_reserved[2]), iVar3 == 0))
        goto LAB_0045353e;
      }
      bytes_to_send._4_4_ = 0;
      iVar2 = bytes_to_send._4_4_;
      if (((*(uint *)(fs_req.bufsml[3].len + 0x11c) & 2) != 0) ||
         ((*(uint *)(fs_req.bufsml[3].len + 0x11c) & 4) != 0)) {
        iVar3 = ioctl((int)src_statsbuf.__glibc_reserved[2],0x40049409,(ulong)__fd);
        if (iVar3 == 0) goto LAB_0045353e;
        if ((*(uint *)(fs_req.bufsml[3].len + 0x11c) & 4) != 0) {
          piVar4 = __errno_location();
          iVar2 = -*piVar4;
          goto LAB_0045353e;
        }
      }
      bytes_written = 0;
      for (in_offset = src_statsbuf.st_rdev; in_offset != 0; in_offset = in_offset - (long)p_Var1) {
        local_328 = 0x7fffffffffffffff;
        if (in_offset < 0x7fffffffffffffff) {
          local_328 = in_offset;
        }
        uv_fs_sendfile((uv_loop_t *)0x0,(uv_fs_t *)&dstfd,(int)src_statsbuf.__glibc_reserved[2],__fd
                       ,bytes_written,local_328,(uv_fs_cb)0x0);
        p_Var1 = fs_req.cb;
        uv_fs_req_cleanup((uv_fs_t *)&dstfd);
        if ((long)p_Var1 < 0) {
          iVar2 = (int)p_Var1;
          break;
        }
        bytes_written = (off_t)(p_Var1 + bytes_written);
      }
    }
  }
  else {
    piVar4 = __errno_location();
    iVar2 = -*piVar4;
  }
LAB_0045353e:
  bytes_to_send._4_4_ = iVar2;
  if (bytes_to_send._4_4_ < 0) {
    local_300 = bytes_to_send._4_4_;
  }
  else {
    local_300 = 0;
  }
  iVar2 = uv__close_nocheckstdio(__fd);
  if ((iVar2 != 0) && (local_300 == 0)) {
    local_300 = iVar2;
  }
  if (-1 < (int)src_statsbuf.__glibc_reserved[2]) {
    iVar2 = uv__close_nocheckstdio((int)src_statsbuf.__glibc_reserved[2]);
    if ((iVar2 != 0) && (local_300 == 0)) {
      local_300 = iVar2;
    }
    if (local_300 != 0) {
      uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)&dstfd,*(char **)(fs_req.bufsml[3].len + 0x110),
                   (uv_fs_cb)0x0);
      uv_fs_req_cleanup((uv_fs_t *)&dstfd);
    }
  }
  if (local_300 == 0) {
    req_local = (uv_fs_t *)0x0;
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = -local_300;
    req_local = (uv_fs_t *)0xffffffffffffffff;
  }
  return (ssize_t)req_local;
}

Assistant:

static ssize_t uv__fs_copyfile(uv_fs_t* req) {
  uv_fs_t fs_req;
  uv_file srcfd;
  uv_file dstfd;
  struct stat src_statsbuf;
  struct stat dst_statsbuf;
  int dst_flags;
  int result;
  int err;
  off_t bytes_to_send;
  off_t in_offset;
  off_t bytes_written;
  size_t bytes_chunk;

  dstfd = -1;
  err = 0;

  /* Open the source file. */
  srcfd = uv_fs_open(NULL, &fs_req, req->path, O_RDONLY, 0, NULL);
  uv_fs_req_cleanup(&fs_req);

  if (srcfd < 0)
    return srcfd;

  /* Get the source file's mode. */
  if (fstat(srcfd, &src_statsbuf)) {
    err = UV__ERR(errno);
    goto out;
  }

  dst_flags = O_WRONLY | O_CREAT;

  if (req->flags & UV_FS_COPYFILE_EXCL)
    dst_flags |= O_EXCL;

  /* Open the destination file. */
  dstfd = uv_fs_open(NULL,
                     &fs_req,
                     req->new_path,
                     dst_flags,
                     src_statsbuf.st_mode,
                     NULL);
  uv_fs_req_cleanup(&fs_req);

  if (dstfd < 0) {
    err = dstfd;
    goto out;
  }

  /* If the file is not being opened exclusively, verify that the source and
     destination are not the same file. If they are the same, bail out early. */
  if ((req->flags & UV_FS_COPYFILE_EXCL) == 0) {
    /* Get the destination file's mode. */
    if (fstat(dstfd, &dst_statsbuf)) {
      err = UV__ERR(errno);
      goto out;
    }

    /* Check if srcfd and dstfd refer to the same file */
    if (src_statsbuf.st_dev == dst_statsbuf.st_dev &&
        src_statsbuf.st_ino == dst_statsbuf.st_ino) {
      goto out;
    }

    /* Truncate the file in case the destination already existed. */
    if (ftruncate(dstfd, 0) != 0) {
      err = UV__ERR(errno);
      goto out;
    }
  }

  if (fchmod(dstfd, src_statsbuf.st_mode) == -1) {
    err = UV__ERR(errno);
#ifdef __linux__
    /* fchmod() on CIFS shares always fails with EPERM unless the share is
     * mounted with "noperm". As fchmod() is a meaningless operation on such
     * shares anyway, detect that condition and squelch the error.
     */
    if (err != UV_EPERM)
      goto out;

    if (!uv__is_cifs_or_smb(dstfd))
      goto out;

    err = 0;
#else  /* !__linux__ */
    goto out;
#endif  /* !__linux__ */
  }

#ifdef FICLONE
  if (req->flags & UV_FS_COPYFILE_FICLONE ||
      req->flags & UV_FS_COPYFILE_FICLONE_FORCE) {
    if (ioctl(dstfd, FICLONE, srcfd) == 0) {
      /* ioctl() with FICLONE succeeded. */
      goto out;
    }
    /* If an error occurred and force was set, return the error to the caller;
     * fall back to sendfile() when force was not set. */
    if (req->flags & UV_FS_COPYFILE_FICLONE_FORCE) {
      err = UV__ERR(errno);
      goto out;
    }
  }
#else
  if (req->flags & UV_FS_COPYFILE_FICLONE_FORCE) {
    err = UV_ENOSYS;
    goto out;
  }
#endif

  bytes_to_send = src_statsbuf.st_size;
  in_offset = 0;
  while (bytes_to_send != 0) {
    bytes_chunk = SSIZE_MAX;
    if (bytes_to_send < (off_t) bytes_chunk)
      bytes_chunk = bytes_to_send;
    uv_fs_sendfile(NULL, &fs_req, dstfd, srcfd, in_offset, bytes_chunk, NULL);
    bytes_written = fs_req.result;
    uv_fs_req_cleanup(&fs_req);

    if (bytes_written < 0) {
      err = bytes_written;
      break;
    }

    bytes_to_send -= bytes_written;
    in_offset += bytes_written;
  }

out:
  if (err < 0)
    result = err;
  else
    result = 0;

  /* Close the source file. */
  err = uv__close_nocheckstdio(srcfd);

  /* Don't overwrite any existing errors. */
  if (err != 0 && result == 0)
    result = err;

  /* Close the destination file if it is open. */
  if (dstfd >= 0) {
    err = uv__close_nocheckstdio(dstfd);

    /* Don't overwrite any existing errors. */
    if (err != 0 && result == 0)
      result = err;

    /* Remove the destination file if something went wrong. */
    if (result != 0) {
      uv_fs_unlink(NULL, &fs_req, req->new_path, NULL);
      /* Ignore the unlink return value, as an error already happened. */
      uv_fs_req_cleanup(&fs_req);
    }
  }

  if (result == 0)
    return 0;

  errno = UV__ERR(result);
  return -1;
}